

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_every(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSValue obj_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue obj_01;
  JSValue obj_02;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue this_val_00;
  JSValue obj_03;
  JSValue func_obj;
  JSValue prop;
  JSValue obj_04;
  JSValue this_obj_02;
  JSValue val_05;
  JSValue val_06;
  JSValue this_val_01;
  JSValue this_val_02;
  JSValue len_val;
  JSValue len_val_00;
  JSValue obj_05;
  JSValue obj_06;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion ctx_00;
  int64_t *piVar4;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  uint in_R9D;
  JSValue JVar5;
  JSValue arr;
  int present;
  int64_t n;
  int64_t k;
  int64_t len;
  JSValue this_arg;
  JSValue func;
  JSValue args [3];
  JSValue ret;
  JSValue res;
  JSValue index_val;
  JSValue val;
  JSValue obj;
  JSValue v_1;
  JSValue v;
  undefined4 in_stack_fffffffffffffbb8;
  int32_t iVar6;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffbbc;
  JSValueUnion JVar8;
  undefined4 uVar9;
  JSContext *in_stack_fffffffffffffbc0;
  JSValueUnion in_stack_fffffffffffffbc8;
  JSValueUnion in_stack_fffffffffffffbd0;
  int64_t *in_stack_fffffffffffffbd8;
  JSContext *in_stack_fffffffffffffbe0;
  int32_t in_stack_fffffffffffffbe8;
  JSAtom in_stack_fffffffffffffbec;
  int64_t in_stack_fffffffffffffbf0;
  JSValueUnion in_stack_fffffffffffffbf8;
  JSContext *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc14;
  JSContext *in_stack_fffffffffffffc18;
  JSValueUnion JVar10;
  JSValueUnion in_stack_fffffffffffffc20;
  int64_t iVar11;
  JSValueUnion in_stack_fffffffffffffc28;
  JSValueUnion in_stack_fffffffffffffc30;
  int64_t in_stack_fffffffffffffc38;
  JSValue *in_stack_fffffffffffffc40;
  uint in_stack_fffffffffffffc4c;
  JSValueUnion in_stack_fffffffffffffc50;
  JSValueUnion in_stack_fffffffffffffc58;
  int64_t in_stack_fffffffffffffc60;
  JSContext *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  int64_t in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  uint in_stack_fffffffffffffc8c;
  int64_t in_stack_fffffffffffffc90;
  JSValueUnion local_368;
  JSContext *local_360;
  JSValueUnion local_348;
  int64_t local_340;
  JSValueUnion local_338;
  int64_t local_330;
  JSValueUnion local_318;
  int64_t local_310;
  JSValueUnion local_2e8;
  int64_t local_2e0;
  JSValueUnion local_2c8;
  int64_t local_2c0;
  uint uStack_2b4;
  undefined4 uStack_2a4;
  JSValueUnion local_288;
  int64_t local_280;
  JSValueUnion local_278;
  int64_t local_270;
  uint uStack_264;
  uint uStack_254;
  int local_244;
  int64_t *local_240;
  long local_238;
  long local_230;
  JSValueUnion local_208;
  int64_t iStack_200;
  JSValueUnion local_1f8;
  int64_t local_1f0;
  JSValueUnion local_1e8;
  int64_t local_1e0;
  JSValueUnion local_1d0;
  int64_t local_1c8;
  JSValueUnion local_1c0;
  JSContext *local_1b8;
  JSValueUnion local_1b0;
  int64_t local_1a8;
  JSValueUnion local_1a0;
  int64_t local_198;
  JSValueUnion local_190;
  int64_t iStack_188;
  uint local_17c;
  JSValueUnion local_168;
  int32_t local_150;
  undefined4 uStack_14c;
  int64_t local_148;
  undefined4 local_13c;
  JSValueUnion local_138;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  int local_11c;
  JSValueUnion local_118;
  int local_110;
  undefined8 local_108;
  int local_fc;
  JSValueUnion local_f8;
  int local_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined4 local_dc;
  JSValueUnion local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_b0;
  undefined8 local_a8;
  long local_a0;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int64_t local_88;
  int local_7c;
  JSValueUnion local_78;
  int local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  undefined8 local_48;
  long local_40;
  JSValueUnion local_38;
  JSValueUnion local_30;
  int64_t local_28;
  int local_1c;
  JSValueUnion local_18;
  int local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_1d0.ptr = (void *)((ulong)uStack_254 << 0x20);
  local_1c8 = 3;
  local_1a0.ptr = (void *)((ulong)uStack_264 << 0x20);
  local_198 = 3;
  local_17c = in_R9D;
  local_168 = in_RDI;
  if ((in_R9D & 8) == 0) {
    val_06.tag = in_stack_fffffffffffffc60;
    val_06.u.ptr = in_stack_fffffffffffffc58.ptr;
    JVar5 = JS_ToObject((JSContext *)in_stack_fffffffffffffc50.ptr,val_06);
    local_288 = JVar5.u;
    local_190 = local_288;
    local_280 = JVar5.tag;
    iStack_188 = local_280;
    JVar5.u._4_4_ = in_stack_fffffffffffffbec;
    JVar5.u.int32 = in_stack_fffffffffffffbe8;
    JVar5.tag = in_stack_fffffffffffffbf0;
    iVar2 = js_get_length64(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,JVar5);
    if (iVar2 == 0) goto LAB_001ae12b;
    goto LAB_001aef3e;
  }
  v_12.tag = in_RDX;
  v_12.u.float64 = in_RSI.float64;
  JVar5 = JS_DupValue((JSContext *)in_RDI.ptr,v_12);
  local_278 = JVar5.u;
  local_190 = local_278;
  local_270 = JVar5.tag;
  iStack_188 = local_270;
  obj_01.tag = (int64_t)in_stack_fffffffffffffbd8;
  obj_01.u.ptr = in_stack_fffffffffffffbd0.ptr;
  iVar2 = js_typed_array_get_length_internal((JSContext *)in_stack_fffffffffffffbc8.ptr,obj_01);
  local_230 = (long)iVar2;
  if (local_230 < 0) goto LAB_001aef3e;
LAB_001ae12b:
  obj_02.tag = (int64_t)in_stack_fffffffffffffbd8;
  obj_02.u.ptr = in_stack_fffffffffffffbd0.ptr;
  iVar2 = check_function((JSContext *)in_stack_fffffffffffffbc8.ptr,obj_02);
  if (iVar2 != 0) goto LAB_001aef3e;
  ctx_00._4_4_ = 0;
  ctx_00.int32 = local_17c;
  switch(ctx_00) {
  case (JSValueUnion)0x0:
  case (JSValueUnion)0x8:
    local_1d0._4_4_ = uStack_2a4;
    local_1d0.int32 = 1;
    local_1c8 = 1;
    goto switchD_001ae1fb_caseD_2;
  case (JSValueUnion)0x1:
  case (JSValueUnion)0x9:
    local_1d0.ptr = (void *)((ulong)uStack_2b4 << 0x20);
    local_1c8 = 1;
  default:
    goto switchD_001ae1fb_caseD_2;
  case (JSValueUnion)0x3:
    in_stack_fffffffffffffbe8 = local_168.int32;
    in_stack_fffffffffffffbec = local_168._4_4_;
    local_38 = local_168;
    local_40 = local_230;
    if (local_230 == (int)local_230) {
      local_18 = local_168;
      local_1c = (int)local_230;
      local_10 = (int)local_230;
      local_8 = 0;
      local_50._4_4_ = uStack_c;
      local_50.int32 = (int)local_230;
      local_48 = 0;
      local_28 = 0;
      local_30 = local_50;
    }
    else {
      _local_60 = __JS_NewFloat64((JSContext *)local_168.ptr,(double)local_230);
      local_30 = local_60;
      local_28 = local_58;
    }
    obj_05.u._4_4_ = in_stack_fffffffffffffc8c;
    obj_05.u.int32 = in_stack_fffffffffffffc88;
    obj_05.tag = in_stack_fffffffffffffc90;
    len_val.u._4_4_ = in_stack_fffffffffffffc7c;
    len_val.u.int32 = in_stack_fffffffffffffc78;
    len_val.tag = in_stack_fffffffffffffc80;
    JVar5 = JS_ArraySpeciesCreate(in_stack_fffffffffffffc70,obj_05,len_val);
    local_2c8 = JVar5.u;
    local_1d0 = local_2c8;
    local_2c0 = JVar5.tag;
    local_1c8 = local_2c0;
    iVar2 = JS_IsException(JVar5);
    break;
  case (JSValueUnion)0x4:
    local_d8 = local_168;
    local_dc = 0;
    local_d0 = 0;
    local_c8 = 0;
    obj_06.u._4_4_ = in_stack_fffffffffffffc8c;
    obj_06.u.int32 = in_stack_fffffffffffffc88;
    obj_06.tag = in_stack_fffffffffffffc90;
    len_val_00.u._4_4_ = in_stack_fffffffffffffc7c;
    len_val_00.u.int32 = in_stack_fffffffffffffc78;
    len_val_00.tag = in_stack_fffffffffffffc80;
    JVar5 = JS_ArraySpeciesCreate(in_stack_fffffffffffffc70,obj_06,len_val_00);
    local_2e8 = JVar5.u;
    local_1d0 = local_2e8;
    local_2e0 = JVar5.tag;
    local_1c8 = local_2e0;
    iVar2 = JS_IsException(JVar5);
    break;
  case (JSValueUnion)0xb:
    local_208 = local_190;
    iStack_200 = iStack_188;
    local_f8 = local_168;
    local_fc = (int)local_230;
    local_f0 = (int)local_230;
    local_e8 = 0;
    local_1f8._4_4_ = uStack_ec;
    local_1f8.int32 = (int)local_230;
    local_1f0 = 0;
    this_val_01.tag = in_stack_fffffffffffffc60;
    this_val_01.u.ptr = in_stack_fffffffffffffc58.ptr;
    JVar5 = js_typed_array___speciesCreate
                      ((JSContext *)in_stack_fffffffffffffc50.ptr,this_val_01,
                       in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    local_318 = JVar5.u;
    local_1d0 = local_318;
    local_310 = JVar5.tag;
    local_1c8 = local_310;
    iVar2 = JS_IsException(JVar5);
    break;
  case (JSValueUnion)0xc:
    JVar5 = JS_NewArray(in_stack_fffffffffffffbc0);
    local_338 = JVar5.u;
    local_1d0 = local_338;
    local_330 = JVar5.tag;
    local_1c8 = local_330;
    iVar2 = JS_IsException(JVar5);
  }
  if (iVar2 == 0) {
switchD_001ae1fb_caseD_2:
    JVar8._4_4_ = in_stack_fffffffffffffbbc;
    JVar8.int32 = in_stack_fffffffffffffbb8;
    local_240 = (int64_t *)0x0;
    for (local_238 = 0; local_238 < local_230; local_238 = local_238 + 1) {
      if ((local_17c & 8) == 0) {
        obj_04.tag = (int64_t)in_stack_fffffffffffffc30.ptr;
        obj_04.u.float64 = in_stack_fffffffffffffc28.float64;
        local_244 = JS_TryGetPropertyInt64
                              ((JSContext *)in_stack_fffffffffffffc20.ptr,obj_04,
                               (int64_t)in_stack_fffffffffffffc18,
                               (JSValue *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        if (local_244 < 0) goto LAB_001aef3e;
      }
      else {
        obj_03.u._4_4_ = in_stack_fffffffffffffc0c;
        obj_03.u.int32 = in_stack_fffffffffffffc08;
        obj_03.tag._0_4_ = in_stack_fffffffffffffc10;
        obj_03.tag._4_4_ = in_stack_fffffffffffffc14;
        JVar5 = JS_GetPropertyInt64(in_stack_fffffffffffffc00,obj_03,
                                    (int64_t)in_stack_fffffffffffffbf8);
        local_348 = JVar5.u;
        local_1a0 = local_348;
        local_340 = JVar5.tag;
        local_198 = local_340;
        iVar2 = JS_IsException(JVar5);
        if (iVar2 != 0) goto LAB_001aef3e;
        local_244 = 1;
      }
      if (local_244 == 0) goto LAB_001aeceb;
      local_98.float64 = local_168.float64;
      local_a0 = local_238;
      iVar2 = (int)local_238;
      if (local_238 == iVar2) {
        local_78.float64 = local_168.float64;
        local_68 = 0;
        local_b0._4_4_ = uStack_6c;
        local_b0.int32 = iVar2;
        local_a8 = 0;
        local_88 = 0;
        local_90 = local_b0;
        local_7c = iVar2;
        local_70 = iVar2;
      }
      else {
        _local_c0 = __JS_NewFloat64((JSContext *)local_168.ptr,(double)local_238);
        local_90 = local_c0;
        local_88 = local_b8;
      }
      local_1b0.float64 = local_90.float64;
      local_1a8 = local_88;
      v_10.tag = local_88;
      v_10.u.float64 = local_90.float64;
      iVar3 = JS_IsException(v_10);
      if (iVar3 != 0) goto LAB_001aef3e;
      local_208.float64 = local_1a0.float64;
      iStack_200 = local_198;
      local_1f8.float64 = local_1b0.float64;
      local_1f0 = local_1a8;
      local_1e8 = local_190;
      local_1e0 = iStack_188;
      JVar8.ptr = &local_208;
      func_obj.u._4_4_ = in_stack_fffffffffffffc0c;
      func_obj.u.int32 = in_stack_fffffffffffffc08;
      func_obj.tag._0_4_ = in_stack_fffffffffffffc10;
      func_obj.tag._4_4_ = in_stack_fffffffffffffc14;
      this_obj.tag = (int64_t)in_stack_fffffffffffffc00;
      this_obj.u.ptr = in_stack_fffffffffffffbf8.ptr;
      JVar5 = JS_Call((JSContext *)ctx_00.ptr,func_obj,this_obj,in_stack_fffffffffffffbec,
                      (JSValue *)in_stack_fffffffffffffc30.ptr);
      local_368 = JVar5.u;
      local_1c0 = local_368;
      local_360 = (JSContext *)JVar5.tag;
      local_1b8 = local_360;
      v_00.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
      v_00.u.ptr = in_stack_fffffffffffffbc8.ptr;
      JS_FreeValue(in_stack_fffffffffffffbc0,v_00);
      v_09.tag = (int64_t)local_1b8;
      v_09.u.float64 = local_1c0.float64;
      iVar3 = JS_IsException(v_09);
      uVar9 = JVar8._4_4_;
      if (iVar3 != 0) goto LAB_001aef3e;
      in_stack_fffffffffffffbe0 = (JSContext *)(ulong)local_17c;
      switch(in_stack_fffffffffffffbe0) {
      case (JSContext *)0x0:
      case (JSContext *)0x8:
        val_02.tag = (int64_t)in_stack_fffffffffffffbf8.ptr;
        val_02.u.ptr = ctx_00.ptr;
        iVar2 = JS_ToBoolFree((JSContext *)
                              CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),val_02);
        if (iVar2 == 0) {
          local_1d0.ptr = (void *)((ulong)in_stack_fffffffffffffc8c << 0x20);
          local_1c8 = 1;
          goto LAB_001aed08;
        }
        break;
      case (JSContext *)0x1:
      case (JSContext *)0x9:
        val_03.tag = (int64_t)in_stack_fffffffffffffbf8.ptr;
        val_03.u.ptr = ctx_00.ptr;
        iVar2 = JS_ToBoolFree((JSContext *)
                              CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),val_03);
        if (iVar2 != 0) {
          local_1d0._4_4_ = in_stack_fffffffffffffc7c;
          local_1d0.int32 = 1;
          local_1c8 = 1;
          goto LAB_001aed08;
        }
        break;
      default:
        v_01.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
        v_01.u.ptr = in_stack_fffffffffffffbc8.ptr;
        JS_FreeValue(in_stack_fffffffffffffbc0,v_01);
        break;
      case (JSContext *)0x3:
        uVar7 = 0x4007;
        this_obj_00.tag = (int64_t)in_stack_fffffffffffffc00;
        this_obj_00.u.ptr = in_stack_fffffffffffffbf8.ptr;
        val_00.u._4_4_ = in_stack_fffffffffffffbec;
        val_00.u.int32 = in_stack_fffffffffffffbe8;
        val_00.tag = (int64_t)ctx_00.ptr;
        iVar2 = JS_DefinePropertyValueInt64
                          (in_stack_fffffffffffffbe0,this_obj_00,(int64_t)in_stack_fffffffffffffbd8,
                           val_00,(int)in_stack_fffffffffffffc70);
        JVar8._4_4_ = uVar9;
        JVar8.int32 = uVar7;
        goto joined_r0x001aebb1;
      case (JSContext *)0x4:
      case (JSContext *)0xc:
        val_04.tag = (int64_t)in_stack_fffffffffffffbf8.ptr;
        val_04.u.ptr = ctx_00.ptr;
        iVar2 = JS_ToBoolFree((JSContext *)
                              CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),val_04);
        uVar9 = JVar8._4_4_;
        if (iVar2 != 0) {
          piVar4 = (int64_t *)((long)local_240 + 1);
          v_11.tag = local_198;
          v_11.u.float64 = local_1a0.float64;
          in_stack_fffffffffffffbd0 = local_168;
          JVar5 = JS_DupValue((JSContext *)local_168.ptr,v_11);
          in_stack_fffffffffffffc58 = JVar5.u;
          in_stack_fffffffffffffc60 = JVar5.tag;
          uVar7 = 0x4007;
          this_obj_01.tag = (int64_t)in_stack_fffffffffffffc00;
          this_obj_01.u.ptr = in_stack_fffffffffffffbf8.ptr;
          val_01.u._4_4_ = in_stack_fffffffffffffbec;
          val_01.u.int32 = in_stack_fffffffffffffbe8;
          val_01.tag = (int64_t)ctx_00.ptr;
          iVar2 = JS_DefinePropertyValueInt64
                            (in_stack_fffffffffffffbe0,this_obj_01,(int64_t)local_240,val_01,
                             (int)in_stack_fffffffffffffc70);
          JVar8._4_4_ = uVar9;
          JVar8.int32 = uVar7;
          in_stack_fffffffffffffbd8 = local_240;
          local_240 = piVar4;
          goto joined_r0x001aebb1;
        }
        break;
      case (JSContext *)0xb:
        local_118.float64 = local_168.float64;
        local_108 = 0;
        in_stack_fffffffffffffc70 = (JSContext *)0x0;
        iVar6 = local_1c0.int32;
        uVar9 = local_1c0._4_4_;
        this_obj_02.tag = in_stack_fffffffffffffc38;
        this_obj_02.u.ptr = in_stack_fffffffffffffc30.ptr;
        prop.tag = (int64_t)in_stack_fffffffffffffc28.ptr;
        prop.u.float64 = in_stack_fffffffffffffc20.float64;
        val_05.tag = (int64_t)in_stack_fffffffffffffc58.ptr;
        val_05.u.ptr = in_stack_fffffffffffffc50.ptr;
        in_stack_fffffffffffffbc0 = local_1b8;
        local_11c = iVar2;
        local_110 = iVar2;
        iVar2 = JS_SetPropertyValue(in_stack_fffffffffffffc18,this_obj_02,prop,val_05,
                                    in_stack_fffffffffffffc14);
        JVar8._4_4_ = uVar9;
        JVar8.int32 = iVar6;
joined_r0x001aebb1:
        if (iVar2 < 0) goto LAB_001aef3e;
      }
      v_02.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
      v_02.u.ptr = in_stack_fffffffffffffbc8.ptr;
      JS_FreeValue(in_stack_fffffffffffffbc0,v_02);
      in_stack_fffffffffffffc50.float64 = 1.48219693752374e-323;
      local_1a0.ptr = (void *)((ulong)in_stack_fffffffffffffc4c << 0x20);
      local_198 = 3;
LAB_001aeceb:
    }
LAB_001aed08:
    if (local_17c != 0xc) {
LAB_001aeee2:
      v_04.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
      v_04.u.ptr = in_stack_fffffffffffffbc8.ptr;
      JS_FreeValue(in_stack_fffffffffffffbc0,v_04);
      v_05.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
      v_05.u.ptr = in_stack_fffffffffffffbc8.ptr;
      JS_FreeValue(in_stack_fffffffffffffbc0,v_05);
      local_150 = local_1d0.int32;
      uStack_14c = local_1d0._4_4_;
      local_148 = local_1c8;
      goto LAB_001aefac;
    }
    local_208 = local_190;
    iStack_200 = iStack_188;
    local_138.float64 = local_168.float64;
    local_13c = local_240._0_4_;
    local_130 = local_240._0_4_;
    local_128 = 0;
    local_1f8._4_4_ = uStack_12c;
    local_1f8.int32 = local_240._0_4_;
    local_1f0 = 0;
    this_val_02.tag = in_stack_fffffffffffffc60;
    this_val_02.u.ptr = in_stack_fffffffffffffc58.ptr;
    JVar5 = js_typed_array___speciesCreate
                      ((JSContext *)in_stack_fffffffffffffc50.ptr,this_val_02,
                       in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40);
    JVar10 = JVar5.u;
    iVar11 = JVar5.tag;
    iVar2 = JS_IsException(JVar5);
    if (iVar2 == 0) {
      local_208 = local_1d0;
      iStack_200 = local_1c8;
      this_val_00.tag = (int64_t)in_stack_fffffffffffffc00;
      this_val_00.u.float64 = in_stack_fffffffffffffbf8.float64;
      JVar5 = JS_Invoke((JSContext *)ctx_00.ptr,this_val_00,in_stack_fffffffffffffbec,
                        in_stack_fffffffffffffbe8,(JSValue *)in_stack_fffffffffffffbe0);
      local_1c0 = JVar5.u;
      local_1b8 = (JSContext *)JVar5.tag;
      obj_00.tag = (int64_t)in_stack_fffffffffffffbc0;
      obj_00.u.float64 = JVar8.float64;
      iVar2 = check_exception_free((JSContext *)0x1aee9b,obj_00);
      if (iVar2 == 0) {
        v_03.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
        v_03.u.ptr = in_stack_fffffffffffffbc8.ptr;
        JS_FreeValue(in_stack_fffffffffffffbc0,v_03);
        local_1d0 = JVar10;
        local_1c8 = iVar11;
        goto LAB_001aeee2;
      }
    }
  }
LAB_001aef3e:
  v_06.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
  v_06.u.ptr = in_stack_fffffffffffffbc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffbc0,v_06);
  v_07.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
  v_07.u.ptr = in_stack_fffffffffffffbc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffbc0,v_07);
  v_08.tag = (int64_t)in_stack_fffffffffffffbd0.ptr;
  v_08.u.ptr = in_stack_fffffffffffffbc8.ptr;
  JS_FreeValue(in_stack_fffffffffffffbc0,v_08);
  local_150 = 0;
  local_148 = 6;
LAB_001aefac:
  JVar1.u._4_4_ = uStack_14c;
  JVar1.u.int32 = local_150;
  JVar1.tag = local_148;
  return JVar1;
}

Assistant:

static JSValue js_array_every(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, res, ret;
    JSValueConst args[3];
    JSValueConst func, this_arg;
    int64_t len, k, n;
    int present;

    ret = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];
    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];
        
    if (check_function(ctx, func))
        goto exception;

    switch (special) {
    case special_every:
    case special_every | special_TA:
        ret = JS_TRUE;
        break;
    case special_some:
    case special_some | special_TA:
        ret = JS_FALSE;
        break;
    case special_map:
        /* XXX: JS_ArraySpeciesCreate should take int64_t */
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt64(ctx, len));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter:
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_map | special_TA:
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, len);
        ret = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter | special_TA:
        ret = JS_NewArray(ctx);
        if (JS_IsException(ret))
            goto exception;
        break;
    }
    n = 0;

    for(k = 0; k < len; k++) {
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = val;
            args[1] = index_val;
            args[2] = obj;
            res = JS_Call(ctx, func, this_arg, 3, args);
            JS_FreeValue(ctx, index_val);
            if (JS_IsException(res))
                goto exception;
            switch (special) {
            case special_every:
            case special_every | special_TA:
                if (!JS_ToBoolFree(ctx, res)) {
                    ret = JS_FALSE;
                    goto done;
                }
                break;
            case special_some:
            case special_some | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    ret = JS_TRUE;
                    goto done;
                }
                break;
            case special_map:
                if (JS_DefinePropertyValueInt64(ctx, ret, k, res,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_map | special_TA:
                if (JS_SetPropertyValue(ctx, ret, JS_NewInt32(ctx, k), res, JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_filter:
            case special_filter | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    if (JS_DefinePropertyValueInt64(ctx, ret, n++, JS_DupValue(ctx, val),
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
                break;
            default:
                JS_FreeValue(ctx, res);
                break;
            }
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
        }
    }
done:
    if (special == (special_filter | special_TA)) {
        JSValue arr;
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, n);
        arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(arr))
            goto exception;
        args[0] = ret;
        res = JS_Invoke(ctx, arr, JS_ATOM_set, 1, args);
        if (check_exception_free(ctx, res))
            goto exception;
        JS_FreeValue(ctx, ret);
        ret = arr;
    }
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return ret;

exception:
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}